

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

Vec_Int_t * Mop_ManCompatiblePairs(Vec_Int_t *vPairs,int nObjs)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  void *__s;
  Vec_Int_t *p;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  iVar3 = nObjs;
  if (nObjs - 1U < 0xf) {
    iVar3 = 0x10;
  }
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar3 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)nObjs << 2);
    }
  }
  uVar2 = vPairs->nSize;
  uVar9 = (ulong)uVar2;
  p = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar6 = uVar2;
  }
  p->nSize = 0;
  p->nCap = uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar6 << 2);
  }
  p->pArray = piVar4;
  if ((int)uVar2 < 1) {
    if (__s == (void *)0x0) {
      return p;
    }
  }
  else {
    piVar4 = vPairs->pArray;
    uVar5 = 0;
    do {
      iVar3 = piVar4[uVar5];
      if (((long)iVar3 < 0) || (nObjs <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (long)iVar3 * 4);
      *piVar1 = *piVar1 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar9);
    if (uVar2 != 1) {
      lVar8 = 1;
      do {
        uVar2 = vPairs->pArray[lVar8 + -1];
        lVar7 = (long)(int)uVar2;
        if ((lVar7 < 0) || ((uint)nObjs <= uVar2)) goto LAB_00336e4e;
        uVar6 = vPairs->pArray[lVar8];
        if (*(int *)((long)__s + lVar7 * 4) == 1) {
          Vec_IntPush(p,uVar2);
          Vec_IntPush(p,uVar6);
          *(undefined4 *)((long)__s + lVar7 * 4) = 0xffffffff;
          if (((int)uVar6 < 0) || ((uint)nObjs <= uVar6)) goto LAB_00336e8c;
LAB_00336ccb:
          *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 0xffffffff;
          uVar9 = (ulong)(uint)vPairs->nSize;
        }
        else {
          if (((int)uVar6 < 0) || ((uint)nObjs <= uVar6)) goto LAB_00336e4e;
          if (*(int *)((long)__s + (ulong)uVar6 * 4) == 1) {
            Vec_IntPush(p,uVar6);
            Vec_IntPush(p,uVar2);
            *(undefined4 *)((long)__s + lVar7 * 4) = 0xffffffff;
            goto LAB_00336ccb;
          }
        }
        lVar8 = lVar8 + 2;
      } while ((int)lVar8 < (int)uVar9);
      if (1 < (int)uVar9) {
        lVar8 = 1;
        do {
          uVar2 = vPairs->pArray[lVar8 + -1];
          lVar7 = (long)(int)uVar2;
          if ((lVar7 < 0) || ((uint)nObjs <= uVar2)) goto LAB_00336e4e;
          if (0 < *(int *)((long)__s + lVar7 * 4)) {
            uVar6 = vPairs->pArray[lVar8];
            if (((int)uVar6 < 0) || ((uint)nObjs <= uVar6)) goto LAB_00336e4e;
            if (0 < *(int *)((long)__s + (ulong)uVar6 * 4)) {
              Vec_IntPush(p,uVar2);
              Vec_IntPush(p,uVar6);
              *(undefined4 *)((long)__s + lVar7 * 4) = 0xffffffff;
              *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 0xffffffff;
              uVar9 = (ulong)(uint)vPairs->nSize;
            }
          }
          lVar8 = lVar8 + 2;
        } while ((int)lVar8 < (int)uVar9);
        if (1 < (int)uVar9) {
          lVar8 = 1;
          do {
            uVar2 = vPairs->pArray[lVar8 + -1];
            lVar7 = (long)(int)uVar2;
            if ((lVar7 < 0) || ((uint)nObjs <= uVar2)) {
LAB_00336e4e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = vPairs->pArray[lVar8];
            if (*(int *)((long)__s + lVar7 * 4) < 1) {
              if (((int)uVar6 < 0) || ((uint)nObjs <= uVar6)) goto LAB_00336e4e;
              if (0 < *(int *)((long)__s + (ulong)uVar6 * 4)) {
                Vec_IntPush(p,uVar6);
                Vec_IntPush(p,uVar2);
                *(undefined4 *)((long)__s + lVar7 * 4) = 0xffffffff;
                goto LAB_00336e12;
              }
            }
            else {
              Vec_IntPush(p,uVar2);
              Vec_IntPush(p,uVar6);
              *(undefined4 *)((long)__s + lVar7 * 4) = 0xffffffff;
              if (((int)uVar6 < 0) || ((uint)nObjs <= uVar6)) {
LAB_00336e8c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
LAB_00336e12:
              *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 0xffffffff;
              uVar9 = (ulong)(uint)vPairs->nSize;
            }
            lVar8 = lVar8 + 2;
          } while ((int)lVar8 < (int)uVar9);
        }
      }
    }
  }
  free(__s);
  return p;
}

Assistant:

Vec_Int_t * Mop_ManCompatiblePairs( Vec_Int_t * vPairs, int nObjs )
{
    int i, Entry, Entry2;
    Vec_Int_t * vCounts = Vec_IntStart( nObjs );
    Vec_Int_t * vPairsNew = Vec_IntAlloc( Vec_IntSize(vPairs) );
    Vec_IntForEachEntry( vPairs, Entry, i )
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    // include pairs which have those that appear only once
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) == 1 || Vec_IntEntry(vCounts, Entry2) == 1 )
        {
            if ( Vec_IntEntry(vCounts, Entry) == 1 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add those remaining pairs that are both present
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 && Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add remaining pairs
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 || Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            if ( Vec_IntEntry(vCounts, Entry) > 0 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    Vec_IntFree( vCounts );
    // verify the result
    if ( 0 )
    {
        Vec_Int_t * vTemp1 = Vec_IntDup( vPairs );
        Vec_Int_t * vTemp2 = Vec_IntDup( vPairsNew );
        Vec_IntUniqify( vTemp1 );
        Vec_IntUniqify( vTemp2 );
        assert( Vec_IntEqual( vTemp1, vTemp2 ) );
        Vec_IntFree( vTemp1 );
        Vec_IntFree( vTemp2 );
    }
    return vPairsNew;
}